

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::LogDestination::SetLogDestination(LogSeverity severity,char *base_filename)

{
  Mutex *this;
  FILE *__stream;
  bool bVar1;
  LogDestination *pLVar2;
  string *__lhs;
  
  if ((uint)severity < 4) {
    ::glog_internal_namespace_::Mutex::Lock((Mutex *)log_mutex);
    pLVar2 = log_destination(severity);
    this = &(pLVar2->fileobject_).lock_;
    ::glog_internal_namespace_::Mutex::Lock(this);
    __lhs = &(pLVar2->fileobject_).base_filename_;
    (pLVar2->fileobject_).base_filename_selected_ = true;
    bVar1 = std::operator!=(__lhs,base_filename);
    if (bVar1) {
      __stream = (FILE *)(pLVar2->fileobject_).file_;
      if (__stream != (FILE *)0x0) {
        fclose(__stream);
        (pLVar2->fileobject_).file_ = (FILE *)0x0;
        (pLVar2->fileobject_).rollover_attempt_ = 0x1f;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (__lhs,base_filename);
    }
    ::glog_internal_namespace_::Mutex::Unlock(this);
    ::glog_internal_namespace_::Mutex::Unlock((Mutex *)log_mutex);
    return;
  }
  __assert_fail("severity >= 0 && severity < NUM_SEVERITIES",
                "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                ,0x29b,
                "static void google::LogDestination::SetLogDestination(LogSeverity, const char *)");
}

Assistant:

inline void LogDestination::SetLogDestination(LogSeverity severity,
					      const char* base_filename) {
  assert(severity >= 0 && severity < NUM_SEVERITIES);
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  MutexLock l(&log_mutex);
  log_destination(severity)->fileobject_.SetBasename(base_filename);
}